

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acbUtil.c
# Opt level: O0

int Acb_NtkComputePathsR(Acb_Ntk_t *p,Vec_Int_t *vTfi,int fReverse)

{
  int iVar1;
  int iVar2;
  int local_28;
  int Path;
  int iObj;
  int i;
  int fReverse_local;
  Vec_Int_t *vTfi_local;
  Acb_Ntk_t *p_local;
  
  local_28 = 0;
  iVar1 = Acb_NtkHasObjPathR(p);
  if (iVar1 == 0) {
    Acb_NtkCleanObjPathR(p);
  }
  if (fReverse == 0) {
    for (Path = 0; iVar1 = Vec_IntSize(vTfi), Path < iVar1; Path = Path + 1) {
      iVar1 = Vec_IntEntry(vTfi,Path);
      iVar2 = Acb_ObjIsCo(p,iVar1);
      if (iVar2 == 0) {
        iVar2 = Acb_ObjSlack(p,iVar1);
        if (iVar2 == 0) {
          Acb_ObjComputePathR(p,iVar1);
        }
        else {
          Acb_ObjSetPathR(p,iVar1,0);
        }
      }
      else {
        iVar2 = Acb_ObjSlack(p,iVar1);
        Acb_ObjSetPathR(p,iVar1,(uint)(iVar2 == 0));
      }
    }
  }
  else {
    Path = Vec_IntSize(vTfi);
    while (Path = Path + -1, -1 < Path) {
      iVar1 = Vec_IntEntry(vTfi,Path);
      iVar2 = Acb_ObjIsCo(p,iVar1);
      if (iVar2 == 0) {
        iVar2 = Acb_ObjSlack(p,iVar1);
        if (iVar2 == 0) {
          Acb_ObjComputePathR(p,iVar1);
        }
        else {
          Acb_ObjSetPathR(p,iVar1,0);
        }
      }
      else {
        iVar2 = Acb_ObjSlack(p,iVar1);
        Acb_ObjSetPathR(p,iVar1,(uint)(iVar2 == 0));
      }
    }
  }
  for (Path = 0; iVar1 = Acb_NtkCiNum(p), Path < iVar1; Path = Path + 1) {
    iVar1 = Acb_NtkCi(p,Path);
    iVar1 = Acb_ObjPathR(p,iVar1);
    local_28 = iVar1 + local_28;
  }
  p->nPaths = local_28;
  return local_28;
}

Assistant:

int Acb_NtkComputePathsR( Acb_Ntk_t * p, Vec_Int_t * vTfi, int fReverse )
{
    int i, iObj, Path = 0;
    if ( !Acb_NtkHasObjPathR( p ) )
        Acb_NtkCleanObjPathR( p );
    // it is assumed that vTfi contains CO nodes
    //assert( Acb_ObjSlack(p, Vec_IntEntry(vTfi, 0)) );
    if ( fReverse )
    {
        Vec_IntForEachEntryReverse( vTfi, iObj, i )
        {
            if ( Acb_ObjIsCo(p, iObj) )
                Acb_ObjSetPathR( p, iObj, Acb_ObjSlack(p, iObj) == 0 );
            else if ( Acb_ObjSlack(p, iObj) )
                Acb_ObjSetPathR( p, iObj, 0 );
            else
                Acb_ObjComputePathR( p, iObj );
        }
    }
    else
    {
        Vec_IntForEachEntry( vTfi, iObj, i )
        {
            if ( Acb_ObjIsCo(p, iObj) )
                Acb_ObjSetPathR( p, iObj, Acb_ObjSlack(p, iObj) == 0 );
            else if ( Acb_ObjSlack(p, iObj) )
                Acb_ObjSetPathR( p, iObj, 0 );
            else
                Acb_ObjComputePathR( p, iObj );
        }
    }
    Acb_NtkForEachCi( p, iObj, i )
        Path += Acb_ObjPathR(p, iObj);
//    assert( p->nPaths == Path );
    p->nPaths = Path;
    return Path;
}